

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O2

void ExchCXX::mgga_screening_interface<ExchCXX::BuiltinPKZB_X>::eval_exc_unpolar
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  double sigma_00;
  double tau_00;
  double dVar1;
  
  if (1e-15 < rho) {
    dVar1 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= sigma) {
      dVar1 = sigma;
    }
    tau_00 = 1e-20;
    if (1e-20 <= tau) {
      tau_00 = tau;
    }
    sigma_00 = rho * 8.0 * tau_00;
    if (dVar1 <= sigma_00) {
      sigma_00 = dVar1;
    }
    kernel_traits<ExchCXX::BuiltinPKZB_X>::eval_exc_unpolar_impl(rho,sigma_00,lapl,tau_00,eps);
    return;
  }
  *eps = 0.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar( double rho, double sigma, double lapl, double tau, double& eps ) {

    
    if( rho <= traits::dens_tol ) {
      eps = 0.;
    } else {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      sigma = safe_max(sigma, sigma_tol_sq); 
      tau   = safe_max(tau, traits::tau_tol);
      if constexpr (not traits::is_kedf) {
        sigma = enforce_fermi_hole_curvature(sigma, rho, tau);
      }

      traits::eval_exc_unpolar_impl(rho, sigma, lapl, tau, eps) ;
    }

  }